

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_BasicPoints_OpenNoPointsHand_Test::
TEST_MinipointCounterTest_BasicPoints_OpenNoPointsHand_Test
          (TEST_MinipointCounterTest_BasicPoints_OpenNoPointsHand_Test *this)

{
  TEST_MinipointCounterTest_BasicPoints_OpenNoPointsHand_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::TEST_GROUP_CppUTestGroupMinipointCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MinipointCounterTest_BasicPoints_OpenNoPointsHand_Test_00257310;
  return;
}

Assistant:

TEST(MinipointCounterTest, BasicPoints_OpenNoPointsHand)
{
	addOpenNoPointHand();
	s.winByDiscard();

	CHECK_EQUAL(30, m.total(false));
	CHECK_EQUAL(30, m.total());
}